

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined2 uVar4;
  EnumValueDescriptor *pEVar2;
  undefined4 uVar5;
  _Alloc_hider _Var6;
  Nonnull<char_*> pcVar7;
  char *in_RCX;
  string_view input;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string local_c0;
  long local_a0;
  Nonnull<char_*> local_98;
  char local_90 [32];
  undefined8 local_70;
  char *local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  char *local_48;
  long local_40;
  Nonnull<char_*> local_38;
  undefined8 local_30;
  char *local_28;
  
  pEVar2 = (descriptor->field_20).default_value_enum_;
  if (pEVar2->all_names_ == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
  }
  else {
    uVar1 = pEVar2->super_SymbolBaseN<0>;
    uVar3 = pEVar2->super_SymbolBaseN<1>;
    uVar4 = *(undefined2 *)&pEVar2->field_0x2;
    uVar5 = pEVar2->number_;
    input._M_len._4_4_ = uVar5;
    input._M_len._2_2_ = uVar4;
    input._M_len._1_1_ = uVar3;
    input._M_len._0_1_ = uVar1;
    input._M_str = in_RCX;
    StringToBase64_abi_cxx11_(&local_c0,(csharp *)pEVar2->all_names_,input);
    _Var6._M_p = local_c0._M_dataplus._M_p;
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (((descriptor->field_20).default_value_string_)->_M_string_length,local_90);
    local_a0 = (long)pcVar7 - (long)local_90;
    local_70 = 0x55;
    local_68 = 
    "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\"";
    local_60 = local_c0._M_string_length;
    local_58 = _Var6._M_p;
    local_50 = 7;
    local_48 = "\"), 0, ";
    local_30 = 1;
    local_28 = ")";
    pieces._M_len = (size_type)"\"), 0, ";
    pieces._M_array = (iterator)&DAT_00000005;
    local_98 = local_90;
    local_40 = local_a0;
    local_38 = local_90;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              (__return_storage_ptr__,(strings_internal *)&local_70,pieces);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    return absl::StrCat(
        "global::System.Text.Encoding.UTF8.GetString(global::System."
        "Convert.FromBase64String(\"",
        StringToBase64(descriptor->default_value_string()), "\"), 0, ",
        descriptor->default_value_string().length(), ")");
}